

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O3

void Omega_h::make_3d_box(Real x,Real y,Real z,LO nx,LO ny,LO nz,LOs *hv2v_out,Reals *coords_out)

{
  int iVar1;
  Alloc *pAVar2;
  ulong uVar3;
  LOs *pLVar4;
  Reals *pRVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Alloc *this;
  Alloc *pAVar10;
  double *pdVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  IntIterator last;
  int iVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Write<int> hv2v;
  Write<double> coords;
  string local_d8;
  LOs *local_b8;
  Reals *local_b0;
  Write<int> local_a8;
  Write<double> local_98;
  Alloc *local_88;
  Alloc *local_70;
  Write<double> local_68;
  Write<int> local_58;
  Real local_48;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_b8 = hv2v_out;
  local_b0 = coords_out;
  local_88 = (Alloc *)x;
  local_48 = y;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  iVar1 = nx + 1;
  iVar17 = (ny + 1) * iVar1;
  iVar18 = (nz + 1) * iVar17;
  Write<double>::Write(&local_98,iVar18 * 3,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      this = (Alloc *)((local_98.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + 1;
    }
  }
  bVar19 = ((ulong)this & 7) == 0;
  pAVar10 = this;
  if (bVar19 && this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar10 = (Alloc *)(this->size * 8 + 1);
    }
    else {
      this->use_count = this->use_count + 1;
    }
  }
  bVar20 = ((ulong)pAVar10 & 7) == 0;
  if (iVar18 < 1) {
    if (bVar20 && pAVar10 != (Alloc *)0x0) goto LAB_0023124e;
  }
  else {
    auVar22._0_8_ = (double)nx;
    auVar22._8_8_ = (double)ny;
    auVar21._8_8_ = local_48;
    auVar21._0_8_ = local_88;
    if (bVar20 && pAVar10 != (Alloc *)0x0) {
      pAVar10->use_count = pAVar10->use_count + -1;
      pAVar10 = (Alloc *)(pAVar10->size * 8 + 1);
    }
    auVar22 = divpd(auVar21,auVar22);
    entering_parallel = '\0';
    pdVar11 = (double *)((long)local_98.shared_alloc_.direct_ptr + 0x10);
    iVar7 = 0;
    do {
      uVar3 = (ulong)(uint)((int)((long)iVar7 % (long)iVar17) >> 0x1f) << 0x20 |
              (long)iVar7 % (long)iVar17 & 0xffffffffU;
      pdVar11[-2] = (double)(int)((long)uVar3 % (long)iVar1) * auVar22._0_8_;
      pdVar11[-1] = (double)(int)((long)uVar3 / (long)iVar1) * auVar22._8_8_;
      *pdVar11 = (double)(iVar7 / iVar17) * (z / (double)nz);
      iVar7 = iVar7 + 1;
      pdVar11 = pdVar11 + 3;
    } while (iVar18 != iVar7);
    if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
LAB_0023124e:
      piVar12 = &pAVar10->use_count;
      *piVar12 = *piVar12 + -1;
      if (*piVar12 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
      }
    }
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  iVar18 = ny * nx;
  iVar7 = nz * iVar18;
  Write<int>::Write(&local_a8,iVar7 * 8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pRVar5 = local_b0;
  pLVar4 = local_b8;
  local_88 = local_a8.shared_alloc_.alloc;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  bVar20 = ((ulong)local_88 & 7) == 0;
  local_48 = (Real)CONCAT71(local_48._1_7_,bVar20 && local_88 != (Alloc *)0x0);
  pAVar10 = local_88;
  if (bVar20 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar10 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  bVar20 = ((ulong)pAVar10 & 7) != 0;
  if (iVar7 < 1) {
    if (bVar20 || pAVar10 == (Alloc *)0x0) goto LAB_00231475;
    piVar12 = &pAVar10->use_count;
    *piVar12 = *piVar12 + -1;
    iVar1 = *piVar12;
  }
  else {
    local_70 = local_a8.shared_alloc_.alloc;
    if (!bVar20 && pAVar10 != (Alloc *)0x0) {
      pAVar10->use_count = pAVar10->use_count + -1;
      pAVar10 = (Alloc *)(pAVar10->size * 8 + 1);
    }
    entering_parallel = '\0';
    piVar12 = (int *)((long)local_a8.shared_alloc_.direct_ptr + 0x1c);
    iVar8 = 0;
    do {
      uVar3 = (ulong)(uint)((int)((long)iVar8 % (long)iVar18) >> 0x1f) << 0x20 |
              (long)iVar8 % (long)iVar18 & 0xffffffffU;
      iVar15 = (iVar8 / iVar18) * iVar17;
      iVar6 = (int)((long)uVar3 / (long)nx);
      iVar13 = iVar6 * iVar1;
      iVar9 = (int)((long)uVar3 % (long)nx);
      iVar14 = iVar15 + iVar9;
      iVar15 = iVar15 + iVar9 + 1;
      piVar12[-7] = iVar13 + iVar14;
      iVar6 = (iVar6 + 1) * iVar1;
      piVar12[-6] = iVar15 + iVar13;
      piVar12[-5] = iVar15 + iVar6;
      iVar15 = (iVar8 / iVar18 + 1) * iVar17;
      iVar16 = iVar15 + iVar9 + 1;
      piVar12[-4] = iVar14 + iVar6;
      iVar9 = iVar9 + iVar15;
      piVar12[-3] = iVar9 + iVar13;
      piVar12[-2] = iVar13 + iVar16;
      piVar12[-1] = iVar16 + iVar6;
      *piVar12 = iVar9 + iVar6;
      iVar8 = iVar8 + 1;
      piVar12 = piVar12 + 8;
    } while (iVar7 != iVar8);
    if (((ulong)pAVar10 & 7) != 0 || pAVar10 == (Alloc *)0x0) goto LAB_00231475;
    piVar12 = &pAVar10->use_count;
    *piVar12 = *piVar12 + -1;
    iVar1 = *piVar12;
  }
  if (iVar1 == 0) {
    Alloc::~Alloc(pAVar10);
    operator_delete(pAVar10,0x48);
  }
LAB_00231475:
  local_58.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_58.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
  Read<int>::Read((Read<signed_char> *)&local_d8,&local_58);
  pAVar10 = (pLVar4->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
    piVar12 = &pAVar10->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(pAVar10);
      operator_delete(pAVar10,0x48);
    }
  }
  (pLVar4->write_).shared_alloc_.alloc = (Alloc *)local_d8._M_dataplus._M_p;
  (pLVar4->write_).shared_alloc_.direct_ptr = (void *)local_d8._M_string_length;
  if ((((ulong)local_d8._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_d8._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_d8._M_dataplus._M_p + 0x30) = *(int *)(local_d8._M_dataplus._M_p + 0x30) + -1;
    (pLVar4->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_d8._M_dataplus._M_p * 8 + 1);
  }
  pAVar10 = local_58.shared_alloc_.alloc;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  if (((ulong)local_58.shared_alloc_.alloc & 7) == 0 && local_58.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar12 = &(local_58.shared_alloc_.alloc)->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(local_58.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_88;
  local_68.shared_alloc_.alloc = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.shared_alloc_.alloc = (Alloc *)((local_98.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.shared_alloc_.direct_ptr = local_98.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)&local_d8,&local_68);
  pAVar2 = (pRVar5->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar12 = &pAVar2->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_68.shared_alloc_.alloc;
  (pRVar5->write_).shared_alloc_.alloc = (Alloc *)local_d8._M_dataplus._M_p;
  (pRVar5->write_).shared_alloc_.direct_ptr = (void *)local_d8._M_string_length;
  if ((((ulong)local_d8._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_d8._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_d8._M_dataplus._M_p + 0x30) = *(int *)(local_d8._M_dataplus._M_p + 0x30) + -1;
    (pRVar5->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_d8._M_dataplus._M_p * 8 + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar12 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (local_48._0_1_ != '\0') {
    piVar12 = &pAVar10->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(pAVar10);
      operator_delete(pAVar10,0x48);
    }
  }
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar12 = &(local_a8.shared_alloc_.alloc)->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(local_a8.shared_alloc_.alloc);
      operator_delete(local_a8.shared_alloc_.alloc,0x48);
    }
  }
  if (bVar19 && this != (Alloc *)0x0) {
    piVar12 = &this->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar12 = &(local_98.shared_alloc_.alloc)->use_count;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      Alloc::~Alloc(local_98.shared_alloc_.alloc);
      operator_delete(local_98.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void make_3d_box(Real x, Real y, Real z, LO nx, LO ny, LO nz, LOs* hv2v_out,
    Reals* coords_out) {
  LO nxy = nx * ny;
  LO nh = nx * ny * nz;
  LO nvx = nx + 1;
  LO nvy = ny + 1;
  LO nvz = nz + 1;
  LO nvxy = nvx * nvy;
  LO nv = nvx * nvy * nvz;
  Real dx = x / nx;
  Real dy = y / ny;
  Real dz = z / nz;
  Write<Real> coords(nv * 3);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO ij = v % nvxy;
    LO k = v / nvxy;
    LO i = ij % nvx;
    LO j = ij / nvx;
    coords[v * 3 + 0] = i * dx;
    coords[v * 3 + 1] = j * dy;
    coords[v * 3 + 2] = k * dz;
  };
  parallel_for(nv, fill_coords, "make_3d_box(coords)");
  Write<LO> hv2v(nh * 8);
  auto fill_conn = OMEGA_H_LAMBDA(LO h) {
    LO ij = h % nxy;
    LO k = h / nxy;
    LO i = ij % nx;
    LO j = ij / nx;
    hv2v[h * 8 + 0] = (k + 0) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 1] = (k + 0) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 2] = (k + 0) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 3] = (k + 0) * nvxy + (j + 1) * nvx + (i + 0);
    hv2v[h * 8 + 4] = (k + 1) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 5] = (k + 1) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 6] = (k + 1) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 7] = (k + 1) * nvxy + (j + 1) * nvx + (i + 0);
  };
  parallel_for(nh, fill_conn, "make_3d_box(conn)");
  *hv2v_out = hv2v;
  *coords_out = coords;
}